

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<unsigned_short,unsigned_short>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,unsigned_short *t_lhs,
          unsigned_short *c_lhs,unsigned_short *c_rhs)

{
  ushort uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ushort uVar3;
  undefined8 *puVar4;
  arithmetic_error *paVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  bool b;
  Boxed_Value BVar7;
  string local_48;
  
  switch(t_oper) {
  case equals:
    b = *c_lhs == *c_rhs;
    goto LAB_00285ee8;
  case less_than:
    b = *c_lhs < *c_rhs;
    goto LAB_00285ee8;
  case greater_than:
    b = *c_rhs < *c_lhs;
    goto LAB_00285ee8;
  case less_than_equal:
    b = *c_lhs <= *c_rhs;
    goto LAB_00285ee8;
  case greater_than_equal:
    b = *c_rhs <= *c_lhs;
    goto LAB_00285ee8;
  case not_equal:
    b = *c_lhs != *c_rhs;
LAB_00285ee8:
    BVar7 = const_var((chaiscript *)this,b);
    _Var6._M_pi = BVar7.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_00285f0a;
  default:
    if (t_lhs == (unsigned_short *)0x0) {
switchD_00285f58_caseD_7:
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = &PTR__bad_cast_00320550;
      __cxa_throw(puVar4,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
    switch(t_oper) {
    case assign:
      uVar3 = *c_rhs;
      goto LAB_00285fea;
    default:
      goto switchD_00285f58_caseD_7;
    case assign_product:
      uVar3 = *t_lhs * *c_rhs;
      goto LAB_00285fea;
    case assign_sum:
      *t_lhs = *t_lhs + *c_rhs;
      break;
    case assign_quotient:
      check_divide_by_zero<unsigned_short>(*c_rhs);
      uVar3 = *t_lhs / *c_rhs;
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(*t_lhs % *c_rhs);
LAB_00285fea:
      *t_lhs = uVar3;
      break;
    case assign_difference:
      *t_lhs = *t_lhs - *c_rhs;
      break;
    case assign_bitwise_and:
      check_divide_by_zero<unsigned_short>(*c_rhs);
      *t_lhs = *t_lhs & *c_rhs;
      _Var6._M_pi = extraout_RDX;
      break;
    case assign_bitwise_or:
      *t_lhs = *t_lhs | *c_rhs;
      break;
    case assign_shift_left:
      uVar3 = *t_lhs << ((byte)*c_rhs & 0x1f);
      goto LAB_00285fc3;
    case assign_shift_right:
      uVar3 = *t_lhs >> ((byte)*c_rhs & 0x1f);
LAB_00285fc3:
      *t_lhs = uVar3;
      break;
    case assign_remainder:
      uVar3 = *t_lhs;
      uVar1 = *c_rhs;
      *t_lhs = uVar3 % uVar1;
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(uVar3 % uVar1);
      break;
    case assign_bitwise_xor:
      *t_lhs = *t_lhs ^ *c_rhs;
    }
    (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (t_bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (t_bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->bv).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    goto LAB_00285f0a;
  case shift_left:
    local_48._M_dataplus._M_p._0_4_ = (uint)*c_lhs << ((byte)*c_rhs & 0x1f);
    break;
  case shift_right:
    local_48._M_dataplus._M_p._0_4_ = (uint)(*c_lhs >> ((byte)*c_rhs & 0x1f));
    break;
  case remainder:
    if (*c_rhs == 0) {
      paVar5 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_48.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_48.field_2._8_6_ = 0x6f72657a2079;
      local_48._M_string_length = 0xe;
      local_48.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(paVar5,&local_48);
      __cxa_throw(paVar5,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48._M_dataplus._M_p._0_4_ = (uint)(*c_lhs % *c_rhs);
    break;
  case bitwise_and:
    uVar3 = *c_rhs & *c_lhs;
    goto LAB_00285efa;
  case bitwise_or:
    uVar3 = *c_rhs | *c_lhs;
    goto LAB_00285efa;
  case bitwise_xor:
    uVar3 = *c_rhs ^ *c_lhs;
    goto LAB_00285efa;
  case sum:
    local_48._M_dataplus._M_p._0_4_ = (uint)*c_rhs + (uint)*c_lhs;
    break;
  case quotient:
    if (*c_rhs == 0) {
      paVar5 = (arithmetic_error *)__cxa_allocate_exception(0x10);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48.field_2._M_allocated_capacity._0_6_ = 0x656469766964;
      local_48.field_2._M_allocated_capacity._6_2_ = 0x6220;
      local_48.field_2._8_6_ = 0x6f72657a2079;
      local_48._M_string_length = 0xe;
      local_48.field_2._M_local_buf[0xe] = '\0';
      exception::arithmetic_error::arithmetic_error(paVar5,&local_48);
      __cxa_throw(paVar5,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar3 = *c_lhs / *c_rhs;
LAB_00285efa:
    local_48._M_dataplus._M_p._0_4_ = (uint)uVar3;
    break;
  case product:
    local_48._M_dataplus._M_p._0_4_ = (uint)*c_rhs * (uint)*c_lhs;
    break;
  case difference:
    local_48._M_dataplus._M_p._0_4_ = (uint)*c_lhs - (uint)*c_rhs;
  }
  BVar7 = detail::const_var_impl<int>((detail *)this,(int *)&local_48);
  _Var6._M_pi = BVar7.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_00285f0a:
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }